

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawSpanPalCommand::Execute(DrawSpanPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  dsfixed_t dVar2;
  dsfixed_t dVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  dsfixed_t dVar14;
  dsfixed_t dVar15;
  int iVar16;
  
  bVar10 = DrawerThread::line_skipped_by_thread(thread,(this->super_PalSpanCommand)._y);
  if (!bVar10) {
    puVar5 = (this->super_PalSpanCommand)._source;
    puVar6 = (this->super_PalSpanCommand)._colormap;
    dVar14 = (this->super_PalSpanCommand)._xfrac;
    dVar15 = (this->super_PalSpanCommand)._yfrac;
    iVar1 = (this->super_PalSpanCommand)._x1;
    iVar11 = (&ylookup)[(this->super_PalSpanCommand)._y] + iVar1;
    iVar16 = ((this->super_PalSpanCommand)._x2 - iVar1) + 1;
    dVar2 = (this->super_PalSpanCommand)._xstep;
    dVar3 = (this->super_PalSpanCommand)._ystep;
    iVar1 = (this->super_PalSpanCommand)._xbits;
    iVar4 = (this->super_PalSpanCommand)._ybits;
    puVar7 = (this->super_PalSpanCommand)._destorg;
    if (iVar4 == 6 && iVar1 == 6) {
      lVar13 = 0;
      do {
        puVar7[lVar13 + iVar11] = puVar6[puVar5[dVar15 >> 0x1a | dVar14 >> 0x14 & 0xffffffc0]];
        dVar14 = dVar14 + dVar2;
        dVar15 = dVar15 + dVar3;
        lVar13 = lVar13 + 1;
      } while (iVar16 != (int)lVar13);
    }
    else {
      bVar9 = (byte)iVar4;
      bVar8 = 0x20 - bVar9;
      bVar12 = (byte)iVar1;
      lVar13 = 0;
      do {
        puVar7[lVar13 + iVar11] =
             puVar6[puVar5[(int)((dVar15 >> (bVar8 & 0x1f)) +
                                (dVar14 >> (bVar8 - bVar12 & 0x1f) &
                                ~(-1 << (bVar12 & 0x1f)) << (bVar9 & 0x1f)))]];
        dVar14 = dVar14 + dVar2;
        dVar15 = dVar15 + dVar3;
        lVar13 = lVar13 + 1;
      } while (iVar16 != (int)lVar13);
    }
  }
  return;
}

Assistant:

void DrawSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				// Current texture index in u,v.
				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));

				// Lookup pixel from flat texture tile,
				//  re-index using light/colormap.
				*dest++ = colormap[source[spot]];

				// Next step in u,v.
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;

			do
			{
				// Current texture index in u,v.
				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);

				// Lookup pixel from flat texture tile,
				//  re-index using light/colormap.
				*dest++ = colormap[source[spot]];

				// Next step in u,v.
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}